

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

bool __thiscall S2Polygon::Contains(S2Polygon *this,S2Point *p)

{
  atomic<int> *paVar1;
  int iVar2;
  pointer puVar3;
  bool bVar4;
  bool bVar5;
  int i;
  long lVar6;
  Options local_74;
  S2ContainsPointQuery<MutableS2ShapeIndex> local_70;
  
  if (((this->index_).index_status_._M_i != FRESH) &&
     (bVar4 = S2LatLngRect::Contains(&this->bound_,p), !bVar4)) {
    return false;
  }
  if (this->num_vertices_ < 0x21) {
LAB_00245445:
    bVar4 = false;
    for (lVar6 = 0;
        puVar3 = (this->loops_).
                 super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar6 < (int)((ulong)((long)(this->loops_).
                                    super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 3)
        ; lVar6 = lVar6 + 1) {
      bVar5 = S2Loop::BruteForceContains
                        ((S2Loop *)
                         puVar3[lVar6]._M_t.
                         super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,p);
      bVar4 = (bool)(bVar4 ^ bVar5);
    }
  }
  else {
    if ((this->index_).index_status_._M_i != FRESH) {
      LOCK();
      paVar1 = &this->unindexed_contains_calls_;
      iVar2 = (paVar1->super___atomic_base<int>)._M_i;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      if (iVar2 != 0x13) goto LAB_00245445;
    }
    local_74.vertex_model_ = SEMI_OPEN;
    S2ContainsPointQuery<MutableS2ShapeIndex>::S2ContainsPointQuery
              (&local_70,&this->index_,&local_74);
    bVar4 = S2ContainsPointQuery<MutableS2ShapeIndex>::Contains(&local_70,p);
  }
  return bVar4;
}

Assistant:

bool S2Polygon::Contains(const S2Point& p) const {
  // NOTE(ericv): A bounds check slows down this function by about 50%.  It is
  // worthwhile only when it might allow us to delay building the index.
  if (!index_.is_fresh() && !bound_.Contains(p)) return false;

  // For small polygons it is faster to just check all the crossings.
  // Otherwise we keep track of the number of calls to Contains() and only
  // build the index once enough calls have been made so that we think it is
  // worth the effort.  See S2Loop::Contains(S2Point) for detailed comments.
  static const int kMaxBruteForceVertices = 32;
  static const int kMaxUnindexedContainsCalls = 20;
  if (num_vertices() <= kMaxBruteForceVertices ||
      (!index_.is_fresh() &&
       ++unindexed_contains_calls_ != kMaxUnindexedContainsCalls)) {
    bool inside = false;
    for (int i = 0; i < num_loops(); ++i) {
      // Use brute force to avoid building the loop's S2ShapeIndex.
      inside ^= loop(i)->BruteForceContains(p);
    }
    return inside;
  }
  // Otherwise we look up the S2ShapeIndex cell containing this point.
  return MakeS2ContainsPointQuery(&index_).Contains(p);
}